

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall CaDiCaL::LratChecker::enlarge_vars(LratChecker *this,int64_t idx)

{
  long in_RSI;
  size_type in_RDI;
  vector<signed_char,_std::allocator<signed_char>_> *unaff_retaddr;
  int64_t new_size_vars;
  undefined8 local_28;
  undefined8 local_18;
  size_type __new_size;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_28 = 2;
  }
  else {
    local_28 = *(long *)(in_RDI + 0x10) << 1;
  }
  for (local_18 = local_28; local_18 <= in_RSI; local_18 = local_18 << 1) {
  }
  __new_size = in_RDI;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(unaff_retaddr,in_RDI);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(unaff_retaddr,__new_size);
  *(long *)(in_RDI + 0x10) = local_18;
  return;
}

Assistant:

void LratChecker::enlarge_vars (int64_t idx) {

  assert (0 < idx), assert (idx <= INT_MAX);

  int64_t new_size_vars = size_vars ? 2 * size_vars : 2;
  while (idx >= new_size_vars)
    new_size_vars *= 2;
  LOG ("LRAT CHECKER enlarging variables of checker from %" PRId64
       " to %" PRId64 "",
       size_vars, new_size_vars);

  marks.resize (2 * new_size_vars);
  checked_lits.resize (2 * new_size_vars);

  assert (idx < new_size_vars);
  size_vars = new_size_vars;
}